

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O2

SubtreeArray ts_stack_pop_error(Stack *self,StackVersion version)

{
  anon_struct_16_3_8b926706_for_iterators *self_00;
  uint32_t uVar1;
  StackNode *pSVar2;
  StackIterator *pSVar3;
  StackSlice *pSVar4;
  uint32_t uVar5;
  _Bool _Var6;
  uint uVar7;
  Subtree *pSVar8;
  undefined8 uVar9;
  StackNode *pSVar10;
  uint uVar11;
  ulong uVar12;
  StackIterator *pSVar13;
  SubtreeArray *pSVar14;
  long lVar15;
  _Bool *p_Var16;
  Subtree self_01;
  ulong uVar17;
  byte bVar18;
  bool bVar19;
  SubtreeArray SVar20;
  byte local_b5;
  uint local_a4;
  SubtreeArray subtrees;
  VoidArray VStack_48;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  if ((self->heads).size <= version) {
    __assert_fail("(uint32_t)version < (&self->heads)->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                  ,0x206,"SubtreeArray ts_stack_pop_error(Stack *, StackVersion)");
  }
  pSVar2 = (self->heads).contents[version].node;
  pSVar8 = (Subtree *)0x0;
  lVar15 = 0;
  do {
    if ((ulong)pSVar2->link_count * 0x18 - lVar15 == 0) {
      uVar9 = 0;
LAB_001176a7:
      SVar20.size = (int)uVar9;
      SVar20.capacity = (int)((ulong)uVar9 >> 0x20);
      SVar20.contents = pSVar8;
      return SVar20;
    }
    uVar12 = *(ulong *)((long)&pSVar2->links[0].subtree + lVar15);
    if (((uVar12 != 0) && ((uVar12 & 1) == 0)) && (*(short *)(uVar12 + 0x28) == -1)) {
      (self->slices).size = 0;
      self_00 = &self->iterators;
      (self->iterators).size = 0;
      VStack_48.contents = (Subtree *)0x0;
      VStack_48.size = 0;
      VStack_48.capacity = 0;
      uStack_38 = 0;
      uStack_34 = CONCAT31(uStack_34._1_3_,1);
      array__reserve(&VStack_48,8,1);
      array__grow((VoidArray *)self_00,0x20);
      pSVar13 = (self->iterators).contents;
      uVar11 = (self->iterators).size;
      (self->iterators).size = uVar11 + 1;
      pSVar3 = pSVar13 + uVar11;
      (pSVar3->subtrees).size = VStack_48.size;
      (pSVar3->subtrees).capacity = VStack_48.capacity;
      *(ulong *)(&(pSVar3->subtrees).size + 2) = CONCAT44(uStack_34,uStack_38);
      pSVar13 = pSVar13 + uVar11;
      pSVar13->node = pSVar2;
      (pSVar13->subtrees).contents = (Subtree *)VStack_48.contents;
      bVar19 = false;
LAB_00117735:
      local_a4 = (self->iterators).size;
      if (local_a4 != 0) {
        uVar12 = 0;
LAB_00117747:
        do {
          uVar11 = (uint)uVar12;
          if (local_a4 <= uVar11) goto LAB_00117735;
          pSVar13 = self_00->contents + uVar12;
          pSVar14 = &pSVar13->subtrees;
          pSVar2 = pSVar13->node;
          bVar18 = (pSVar13->subtrees).size != 0;
          if ((bool)bVar18 && !bVar19) {
            if (((ulong)pSVar14->contents->ptr & 1) == 0) {
              bVar19 = pSVar14->contents->ptr->symbol == 0xffff;
              bVar18 = bVar19 * '\x02' + 1;
              goto LAB_001177a9;
            }
            bVar19 = false;
LAB_001179a8:
            ts_subtree_array_delete(self->subtree_pool,pSVar14);
          }
          else {
LAB_001177a9:
            if ((bVar18 & 1) == 0) {
              if (bVar18 < 2) {
                if (pSVar2->link_count == 0) goto LAB_001179a8;
              }
              else {
                subtrees.contents = pSVar14->contents;
                subtrees.size = (pSVar13->subtrees).size;
                subtrees.capacity = (pSVar13->subtrees).capacity;
                if (pSVar2->link_count == 0) goto LAB_0011797c;
                ts_subtree_array_copy(*pSVar14,&subtrees);
                ts_subtree_array_reverse(&subtrees);
                ts_stack__add_slice(self,version,pSVar2,&subtrees);
              }
              p_Var16 = &pSVar2->links[1].is_pending;
              for (uVar17 = 1; uVar17 <= pSVar2->link_count; uVar17 = uVar17 + 1) {
                if (uVar17 == pSVar2->link_count) {
                  pSVar10 = pSVar2->links[0].node;
                  self_01 = pSVar2->links[0].subtree;
                  local_b5 = pSVar2->links[0].is_pending;
                  pSVar13 = self_00->contents + uVar12;
LAB_00117901:
                  pSVar13->node = pSVar10;
                  if (self_01.ptr == (SubtreeHeapData *)0x0) {
                    pSVar13->subtree_count = pSVar13->subtree_count + 1;
                  }
                  else {
                    array__grow((VoidArray *)&pSVar13->subtrees,8);
                    uVar7 = (pSVar13->subtrees).size;
                    (pSVar13->subtrees).size = uVar7 + 1;
                    (pSVar13->subtrees).contents[uVar7] = self_01;
                    ts_subtree_retain(self_01);
                    _Var6 = ts_subtree_extra(self_01);
                    if ((_Var6) ||
                       (pSVar13->subtree_count = pSVar13->subtree_count + 1, (local_b5 & 1) != 0))
                    goto LAB_00117953;
                  }
                  pSVar13->is_pending = false;
                }
                else if ((self->iterators).size < 0x40) {
                  pSVar10 = ((StackLink *)(p_Var16 + -0x10))->node;
                  self_01 = *(Subtree *)(p_Var16 + -8);
                  local_b5 = *p_Var16;
                  pSVar3 = (self->iterators).contents;
                  pSVar13 = pSVar3 + uVar12;
                  subtrees.contents = (Subtree *)pSVar13->node;
                  subtrees._8_8_ = (pSVar13->subtrees).contents;
                  pSVar3 = pSVar3 + uVar12;
                  uVar1 = (pSVar3->subtrees).size;
                  uVar5 = (pSVar3->subtrees).capacity;
                  uVar9 = *(undefined8 *)(&(pSVar3->subtrees).size + 2);
                  array__grow((VoidArray *)self_00,0x20);
                  pSVar13 = (self->iterators).contents;
                  uVar7 = (self->iterators).size;
                  (self->iterators).size = uVar7 + 1;
                  pSVar3 = pSVar13 + uVar7;
                  (pSVar3->subtrees).size = uVar1;
                  (pSVar3->subtrees).capacity = uVar5;
                  *(undefined8 *)(&(pSVar3->subtrees).size + 2) = uVar9;
                  pSVar13 = pSVar13 + uVar7;
                  pSVar13->node = (StackNode *)subtrees.contents;
                  (pSVar13->subtrees).contents = (Subtree *)subtrees._8_8_;
                  uVar1 = (self->iterators).size;
                  if (uVar1 == 0) {
                    __assert_fail("(uint32_t)(&self->iterators)->size - 1 < (&self->iterators)->size"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                                  ,0x151,
                                  "StackSliceArray stack__iter(Stack *, StackVersion, StackCallback, void *, int)"
                                 );
                  }
                  uVar7 = uVar1 - 1;
                  pSVar13 = self_00->contents + uVar7;
                  pSVar14 = &self_00->contents[uVar7].subtrees;
                  ts_subtree_array_copy(*pSVar14,pSVar14);
                  goto LAB_00117901;
                }
LAB_00117953:
                p_Var16 = p_Var16 + 0x18;
              }
              uVar12 = (ulong)(uVar11 + 1);
              goto LAB_00117747;
            }
            if (bVar18 < 2) goto LAB_001179a8;
            subtrees.contents = pSVar14->contents;
            subtrees.size = (pSVar13->subtrees).size;
            subtrees.capacity = (pSVar13->subtrees).capacity;
LAB_0011797c:
            ts_subtree_array_reverse(&subtrees);
            ts_stack__add_slice(self,version,pSVar2,&subtrees);
          }
          array__erase((VoidArray *)self_00,0x20,uVar11);
          local_a4 = local_a4 - 1;
        } while( true );
      }
      uVar1 = (self->slices).size;
      if (uVar1 == 0) {
        pSVar8 = (Subtree *)0x0;
        uVar9 = 0;
      }
      else {
        if (uVar1 != 1) {
          __assert_fail("pop.size == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                        ,0x20c,"SubtreeArray ts_stack_pop_error(Stack *, StackVersion)");
        }
        pSVar4 = (self->slices).contents;
        ts_stack_renumber_version(self,pSVar4->version,version);
        pSVar8 = (pSVar4->subtrees).contents;
        uVar9._0_4_ = (pSVar4->subtrees).size;
        uVar9._4_4_ = (pSVar4->subtrees).capacity;
      }
      goto LAB_001176a7;
    }
    lVar15 = lVar15 + 0x18;
  } while( true );
}

Assistant:

SubtreeArray ts_stack_pop_error(Stack *self, StackVersion version) {
  StackNode *node = array_get(&self->heads, version)->node;
  for (unsigned i = 0; i < node->link_count; i++) {
    if (node->links[i].subtree.ptr && ts_subtree_is_error(node->links[i].subtree)) {
      bool found_error = false;
      StackSliceArray pop = stack__iter(self, version, pop_error_callback, &found_error, 1);
      if (pop.size > 0) {
        assert(pop.size == 1);
        ts_stack_renumber_version(self, pop.contents[0].version, version);
        return pop.contents[0].subtrees;
      }
      break;
    }
  }
  return (SubtreeArray){.size = 0};
}